

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

AssertionResult __thiscall
testing::internal::CmpHelperFloatingPointEQ<double>
          (internal *this,char *lhs_expression,char *rhs_expression,double lhs_value,
          double rhs_value)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  AssertionResult AVar3;
  FloatingPoint<double> rhs;
  FloatingPoint<double> lhs;
  stringstream rhs_ss;
  stringstream lhs_ss;
  string local_388;
  string local_368;
  FloatingPointUnion local_348;
  FloatingPointUnion local_340;
  stringstream local_338 [16];
  long local_328;
  undefined8 auStack_320 [13];
  ios_base aiStack_2b8 [264];
  stringstream local_1b0 [16];
  long local_1a0;
  undefined8 auStack_198 [13];
  ios_base aiStack_130 [264];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  
  local_348.value_ = rhs_value;
  local_340.value_ = lhs_value;
  bVar1 = FloatingPoint<double>::AlmostEquals
                    ((FloatingPoint<double> *)&local_340,(FloatingPoint<double> *)&local_348);
  if (bVar1) {
    AVar3 = AssertionSuccess();
    sVar2 = AVar3.message_.ptr_;
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1b0);
    *(undefined8 *)((long)auStack_198 + *(long *)(local_1a0 + -0x18)) = 0x11;
    std::ostream::_M_insert<double>(lhs_value);
    std::__cxx11::stringstream::stringstream(local_338);
    *(undefined8 *)((long)auStack_320 + *(long *)(local_328 + -0x18)) = 0x11;
    std::ostream::_M_insert<double>(rhs_value);
    StringStreamToString(&local_368,(stringstream *)local_1b0);
    StringStreamToString(&local_388,(stringstream *)local_338);
    EqFailure(this,lhs_expression,rhs_expression,&local_368,&local_388,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != &local_388.field_2) {
      operator_delete(local_388._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != &local_368.field_2) {
      operator_delete(local_368._M_dataplus._M_p);
    }
    std::__cxx11::stringstream::~stringstream(local_338);
    std::ios_base::~ios_base(aiStack_2b8);
    std::__cxx11::stringstream::~stringstream(local_1b0);
    std::ios_base::~ios_base(aiStack_130);
    sVar2.ptr_ = extraout_RDX;
  }
  AVar3.message_.ptr_ = sVar2.ptr_;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult CmpHelperFloatingPointEQ(const char* lhs_expression,
                                         const char* rhs_expression,
                                         RawType lhs_value,
                                         RawType rhs_value) {
  const FloatingPoint<RawType> lhs(lhs_value), rhs(rhs_value);

  if (lhs.AlmostEquals(rhs)) {
    return AssertionSuccess();
  }

  ::std::stringstream lhs_ss;
  lhs_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
         << lhs_value;

  ::std::stringstream rhs_ss;
  rhs_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
         << rhs_value;

  return EqFailure(lhs_expression,
                   rhs_expression,
                   StringStreamToString(&lhs_ss),
                   StringStreamToString(&rhs_ss),
                   false);
}